

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O3

bool GUIComponentParse(uint32_t line_number,string *gui_component_line,string *uniform_line,
                      vector<GUIComponent,_std::allocator<GUIComponent>_> *previous_components,
                      GUIComponent *out_component,string *out_parse_error)

{
  string *psVar1;
  pointer pcVar2;
  pointer pGVar3;
  size_t __n;
  bool bVar4;
  int iVar5;
  EGUIUniformType EVar6;
  long *plVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  uint uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  GUIComponent *previous_component;
  ulong uVar13;
  pointer pGVar14;
  EGUIComponentType EVar15;
  string uniform_type;
  string component_name;
  anon_class_16_2_f93b81b2 ReportError;
  string component_data;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniform_tokens;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  vector<GUIComponent,_std::allocator<GUIComponent>_> *local_40;
  uint32_t local_34;
  
  local_a8._8_8_ = &local_34;
  local_a8._M_allocated_capacity = (size_type)out_parse_error;
  local_34 = line_number;
  if (uniform_line->_M_string_length == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78,
                   "GUI type not associated with any uniform \'",gui_component_line);
    plVar7 = (long *)std::__cxx11::string::append(local_78._M_local_buf);
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar8) {
      local_b8._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_b8._8_8_ = plVar7[3];
      local_c8._M_allocated_capacity = (size_type)&local_b8;
    }
    else {
      local_b8._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_c8._M_allocated_capacity =
           (size_type)
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar7;
    }
    local_c8._8_8_ = plVar7[1];
    *plVar7 = (long)paVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    GUIComponentParse::anon_class_16_2_f93b81b2::operator()
              ((anon_class_16_2_f93b81b2 *)&local_a8,(string *)local_c8._M_allocated_capacity);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_allocated_capacity != &local_b8) {
      operator_delete((void *)local_c8._M_allocated_capacity,local_b8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_allocated_capacity != &local_68) {
      operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
    }
    return false;
  }
  if (gui_component_line->_M_string_length != 0) {
    uVar10 = 1;
    uVar13 = 0;
    do {
      if ((gui_component_line->_M_dataplus)._M_p[uVar13] == '(') break;
      uVar13 = (ulong)uVar10;
      uVar10 = uVar10 + 1;
    } while (uVar13 < gui_component_line->_M_string_length);
  }
  EVar15 = EGUIComponentTypeSlider1;
  local_40 = previous_components;
  std::__cxx11::string::substr((ulong)&local_c8,(ulong)gui_component_line);
  std::__cxx11::string::substr((ulong)&local_78,(ulong)gui_component_line);
  iVar5 = std::__cxx11::string::compare(local_c8._M_local_buf);
  bVar4 = true;
  if (iVar5 != 0) {
    iVar5 = std::__cxx11::string::compare(local_c8._M_local_buf);
    if (iVar5 == 0) {
      EVar15 = EGUIComponentTypeSlider2;
      goto LAB_0010d44c;
    }
    iVar5 = std::__cxx11::string::compare(local_c8._M_local_buf);
    if (iVar5 == 0) {
      EVar15 = EGUIComponentTypeSlider3;
      goto LAB_0010d44c;
    }
    iVar5 = std::__cxx11::string::compare(local_c8._M_local_buf);
    if (iVar5 == 0) {
      EVar15 = EGUIComponentTypeSlider4;
      goto LAB_0010d44c;
    }
    iVar5 = std::__cxx11::string::compare(local_c8._M_local_buf);
    if (iVar5 == 0) {
      EVar15 = EGUIComponentTypeColor3;
LAB_0010d44a:
      bVar4 = false;
      goto LAB_0010d44c;
    }
    iVar5 = std::__cxx11::string::compare(local_c8._M_local_buf);
    if (iVar5 == 0) {
      EVar15 = EGUIComponentTypeColor4;
      goto LAB_0010d44a;
    }
    std::operator+(&local_108,"Invalid GUI type name \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c8);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_108);
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar8) {
      local_d8._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_d8._8_8_ = plVar7[3];
      local_e8._M_allocated_capacity = (size_type)&local_d8;
    }
    else {
      local_d8._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_e8._M_allocated_capacity =
           (size_type)
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar7;
    }
    local_e8._8_8_ = plVar7[1];
    *plVar7 = (long)paVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    GUIComponentParse::anon_class_16_2_f93b81b2::operator()
              ((anon_class_16_2_f93b81b2 *)&local_a8,(string *)local_e8._M_allocated_capacity);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_allocated_capacity != &local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,local_d8._M_allocated_capacity + 1);
    }
    uVar11 = local_108.field_2._M_allocated_capacity;
    uVar12 = local_108._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) goto LAB_0010d860;
LAB_0010d868:
    bVar4 = false;
    goto LAB_0010d86a;
  }
LAB_0010d44c:
  out_component->Type = EVar15;
  if (local_78._8_8_ == 0) {
    if (bVar4) {
      out_component->field_4 = (anon_union_8_1_70c8c71c_for_GUIComponent_4)0x3f80000000000000;
    }
  }
  else if ((bVar4) &&
          (iVar5 = __isoc99_sscanf(local_78._M_allocated_capacity,"(%f, %f)",&out_component->field_4
                                   ,(undefined1 *)((long)&out_component->field_4 + 4)), iVar5 != 2))
  {
    local_e8._8_8_ = 0;
    local_d8._M_allocated_capacity = local_d8._M_allocated_capacity & 0xffffffffffffff00;
    local_e8._M_allocated_capacity = (size_type)&local_d8;
    std::operator+(&local_98,"Invalid format for GUI component data \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_98);
    paVar8 = &local_108.field_2;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar9) {
      local_108.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_108.field_2._8_8_ = plVar7[3];
      local_108._M_dataplus._M_p = (pointer)paVar8;
    }
    else {
      local_108.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_108._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_108._M_string_length = plVar7[1];
    *plVar7 = (long)paVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::_M_append(local_e8._M_local_buf,(ulong)local_108._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar8) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_98,"Format should be @",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c8);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_98);
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar9) {
      local_108.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_108.field_2._8_8_ = plVar7[3];
      local_108._M_dataplus._M_p = (pointer)paVar8;
    }
    else {
      local_108.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_108._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_108._M_string_length = plVar7[1];
    *plVar7 = (long)paVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::_M_append(local_e8._M_local_buf,(ulong)local_108._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar8) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    GUIComponentParse::anon_class_16_2_f93b81b2::operator()
              ((anon_class_16_2_f93b81b2 *)&local_a8,(string *)local_e8._M_allocated_capacity);
    uVar11 = local_d8._M_allocated_capacity;
    uVar12 = local_e8._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_allocated_capacity != &local_d8) {
LAB_0010d860:
      operator_delete((void *)uVar12,uVar11 + 1);
    }
    goto LAB_0010d868;
  }
  SplitString(&local_58,uniform_line,' ');
  if ((long)local_58.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_58.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x60) {
    iVar5 = std::__cxx11::string::compare
                      ((char *)local_58.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
    if (iVar5 != 0) {
      local_e8._M_allocated_capacity = (size_type)&local_d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,"GUI type not associated with a uniform","");
      GUIComponentParse::anon_class_16_2_f93b81b2::operator()
                ((anon_class_16_2_f93b81b2 *)&local_a8,(string *)local_e8._M_allocated_capacity);
      goto LAB_0010d5b6;
    }
    local_e8._M_allocated_capacity = (size_type)&local_d8;
    pcVar2 = local_58.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,pcVar2,
               pcVar2 + local_58.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
    iVar5 = std::__cxx11::string::compare(local_e8._M_local_buf);
    if (iVar5 == 0) {
      EVar6 = EGUIUniformTypeFloat;
LAB_0010d8c6:
      out_component->UniformType = EVar6;
      if (5 < (ulong)out_component->Type) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/src/gui.h"
                      ,0x58,"uint32_t GUIComponents(EGUIComponentType)");
      }
      if (*(int *)(&DAT_00158720 + (ulong)out_component->Type * 4) != EVar6 + EGUIUniformTypeVec2) {
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_108,"GUI component count does not match uniform component count"
                   ,"");
        GUIComponentParse::anon_class_16_2_f93b81b2::operator()
                  ((anon_class_16_2_f93b81b2 *)&local_a8,(string *)local_108._M_dataplus._M_p);
LAB_0010d9fc:
        local_98.field_2._M_allocated_capacity = local_108.field_2._M_allocated_capacity;
        local_98._M_dataplus._M_p = local_108._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
LAB_0010da0a:
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        goto LAB_0010da12;
      }
      while (local_58.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus._M_p
             [local_58.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length - 1] == ';') {
        std::__cxx11::string::pop_back();
      }
      psVar1 = &out_component->UniformName;
      std::__cxx11::string::_M_assign((string *)psVar1);
      iVar5 = std::__cxx11::string::compare((char *)psVar1);
      if ((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)psVar1), iVar5 == 0)) {
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_108,"GUI type not allowed for builtin uniforms","");
        GUIComponentParse::anon_class_16_2_f93b81b2::operator()
                  ((anon_class_16_2_f93b81b2 *)&local_a8,(string *)local_108._M_dataplus._M_p);
        goto LAB_0010d9fc;
      }
      pGVar14 = (local_40->super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pGVar3 = (local_40->super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      bVar4 = true;
      if (pGVar14 != pGVar3) {
        pcVar2 = (out_component->UniformName)._M_dataplus._M_p;
        __n = (out_component->UniformName)._M_string_length;
        do {
          if (((pGVar14->UniformName)._M_string_length == __n) &&
             ((__n == 0 ||
              (iVar5 = bcmp((pGVar14->UniformName)._M_dataplus._M_p,pcVar2,__n), iVar5 == 0)))) {
            uVar11 = *(undefined8 *)(pGVar14->Data + 2);
            *(undefined8 *)out_component->Data = *(undefined8 *)pGVar14->Data;
            *(undefined8 *)(out_component->Data + 2) = uVar11;
          }
          pGVar14 = pGVar14 + 1;
        } while (pGVar14 != pGVar3);
      }
    }
    else {
      iVar5 = std::__cxx11::string::compare(local_e8._M_local_buf);
      if (iVar5 == 0) {
        EVar6 = EGUIUniformTypeVec2;
        goto LAB_0010d8c6;
      }
      iVar5 = std::__cxx11::string::compare(local_e8._M_local_buf);
      if (iVar5 == 0) {
        EVar6 = EGUIUniformTypeVec3;
        goto LAB_0010d8c6;
      }
      iVar5 = std::__cxx11::string::compare(local_e8._M_local_buf);
      if (iVar5 == 0) {
        EVar6 = EGUIUniformTypeVec4;
        goto LAB_0010d8c6;
      }
      std::operator+(&local_98,"GUI not supported for uniform type \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e8)
      ;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_98);
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 == paVar8) {
        local_108.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_108.field_2._8_8_ = plVar7[3];
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      }
      else {
        local_108.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_108._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_108._M_string_length = plVar7[1];
      *plVar7 = (long)paVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      GUIComponentParse::anon_class_16_2_f93b81b2::operator()
                ((anon_class_16_2_f93b81b2 *)&local_a8,(string *)local_108._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) goto LAB_0010da0a;
LAB_0010da12:
      bVar4 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_allocated_capacity != &local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,local_d8._M_allocated_capacity + 1);
    }
  }
  else {
    local_e8._M_allocated_capacity = (size_type)&local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"GUI associated with invalid uniform","");
    GUIComponentParse::anon_class_16_2_f93b81b2::operator()
              ((anon_class_16_2_f93b81b2 *)&local_a8,(string *)local_e8._M_allocated_capacity);
LAB_0010d5b6:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_allocated_capacity != &local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,local_d8._M_allocated_capacity + 1);
    }
    bVar4 = false;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
LAB_0010d86a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_allocated_capacity != &local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_allocated_capacity != &local_b8) {
    operator_delete((void *)local_c8._M_allocated_capacity,local_b8._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool GUIComponentParse(uint32_t line_number, const std::string& gui_component_line, const std::string& uniform_line, const std::vector<GUIComponent>& previous_components, GUIComponent& out_component, std::string& out_parse_error) {
    auto ReportError = [&](const std::string& error) {
        out_parse_error = error + " at line " + std::to_string(line_number);
    };
    if (uniform_line.empty()) {
        ReportError("GUI type not associated with any uniform '" + gui_component_line + "'");
        return false;
    }
    uint32_t current_char = 0;
    while (current_char < gui_component_line.size() && gui_component_line[current_char] != '(') {
        ++current_char;
    }

    std::string component_name = gui_component_line.substr(0, current_char);
    std::string component_data = gui_component_line.substr(current_char, std::string::npos);
    if (component_name == "slider1") {
        out_component.Type = EGUIComponentTypeSlider1;
    } else if (component_name == "slider2") {
        out_component.Type = EGUIComponentTypeSlider2;
    } else if (component_name == "slider3") {
        out_component.Type = EGUIComponentTypeSlider3;
    } else if (component_name == "slider4") {
        out_component.Type = EGUIComponentTypeSlider4;
    } else if (component_name == "color3") {
        out_component.Type = EGUIComponentTypeColor3;
    } else if (component_name == "color4") {
        out_component.Type = EGUIComponentTypeColor4;
    } else {
        ReportError("Invalid GUI type name '" + component_name + "'");
        return false;
    }

    if (!component_data.empty()) {
        if (GUIIsSliderType(out_component.Type)) {
            int scanned = sscanf(component_data.c_str(), "(%f, %f)",
                &out_component.SliderRange.Start,
                &out_component.SliderRange.End);
            if (scanned != 2) {
                std::string error;
                error += "Invalid format for GUI component data '" + component_data + "'\n";
                error += "Format should be @" + component_name + "(start_range, end_range)";
                ReportError(error);
                return false;
            }
        }
    } else {
        // Initialize the data with convenient defaults
        if (GUIIsSliderType(out_component.Type)) {
            out_component.SliderRange.Start = 0.0f;
            out_component.SliderRange.End = 1.0f;
        }
    }

    std::vector<std::string> uniform_tokens = SplitString(uniform_line,  ' ');
    if (uniform_tokens.size() != 3) {
        ReportError("GUI associated with invalid uniform");
        return false;
    }

    if (uniform_tokens[0] != "uniform") {
        ReportError("GUI type not associated with a uniform");
        return false;
    }

    std::string uniform_type = uniform_tokens[1];
    if (uniform_type == "float") {
        out_component.UniformType = EGUIUniformTypeFloat;
    } else if (uniform_type == "vec2") {
        out_component.UniformType = EGUIUniformTypeVec2;
    } else if (uniform_type == "vec3") {
        out_component.UniformType = EGUIUniformTypeVec3;
    } else if (uniform_type == "vec4") {
        out_component.UniformType = EGUIUniformTypeVec4;
    } else {
        ReportError("GUI not supported for uniform type '" + uniform_type + "'");
        return false;
    }

    if (GUIComponents(out_component.Type) != GUIUniformVariableComponents(out_component.UniformType)) {
        ReportError("GUI component count does not match uniform component count");
        return false;
    }

    // Trim semicolon ';'
    while (uniform_tokens.back().back() == ';') {
        uniform_tokens.back().pop_back();
    }

    out_component.UniformName = uniform_tokens.back();

    if (out_component.UniformName == "time" || out_component.UniformName == "resolution") {
        ReportError("GUI type not allowed for builtin uniforms");
        return false;
    }

    for (const GUIComponent& previous_component : previous_components) {
        if (previous_component.UniformName == out_component.UniformName) {
            memcpy(&out_component.Data, &previous_component.Data, sizeof(out_component.Data));
        }
    }
    return true;
}